

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertions.h
# Opt level: O0

void cgreen::assert_that_<void*>
               (char *file,int line,char *actual_string,void *actual,Constraint *constraint)

{
  bool bVar1;
  string *in_RCX;
  type_info *in_RDX;
  int in_ESI;
  char *in_RDI;
  Constraint_ *in_R8;
  string *local_20;
  undefined4 in_stack_fffffffffffffff0;
  
  local_20 = in_RCX;
  bVar1 = std::type_info::operator==((type_info *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX)
  ;
  if ((((bVar1) ||
       (bVar1 = std::type_info::operator==
                          ((type_info *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX), bVar1))
      || (bVar1 = std::type_info::operator==
                            ((type_info *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX), bVar1)
      ) || (bVar1 = std::type_info::operator==
                              ((type_info *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX),
           bVar1)) {
    cgreen::assert_that_(in_RDI,in_ESI,(char *)in_RDX,local_20,in_R8);
  }
  else {
    bVar1 = std::type_info::operator==
                      ((type_info *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    if (bVar1) {
      cgreen::assert_that_(in_RDI,in_ESI,(char *)in_RDX,(string *)&local_20,in_R8);
    }
    else {
      cgreen::assert_that_(in_RDI,in_ESI,(char *)in_RDX,(long)local_20,in_R8);
    }
  }
  return;
}

Assistant:

void assert_that_(const char *file, int line, const char *actual_string, T actual, Constraint *constraint) {

        if (typeid(actual) == typeid(std::string&) ||
            typeid(actual) == typeid(const std::string&) ||
            typeid(actual) == typeid(const std::string*) ||
            typeid(actual) == typeid(std::string*)) {

            assert_that_(file, line, actual_string, reinterpret_cast<const std::string *>(actual), constraint);

        } else if (typeid(actual) == typeid(std::string)) {

            assert_that_(file, line, actual_string, (const std::string *)&actual, constraint);

        } else {
            // TODO: update actual_string with output from operator<< of (T)actual
            assert_that_(file, line, actual_string, (intptr_t)actual, constraint);
        }
    }